

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O1

int fits_uncompress_hkdata(ParseData *lParse,fitsfile *fptr,long ntimes,double *times,int *status)

{
  uint uVar1;
  iteratorCol *piVar2;
  LONGLONG LVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  char *err_message;
  long lVar9;
  ulong uVar10;
  double local_568;
  int anynul;
  LONGLONG local_558;
  long local_550;
  long naxis2;
  fitsfile *local_540;
  double *local_538;
  double local_530;
  double newtime;
  char *sPtr [1];
  char parName [256];
  char found [1000];
  
  sPtr[0] = parName;
  uVar1 = lParse->nCols;
  local_550 = ntimes;
  local_538 = times;
  if ((ulong)uVar1 != 0) {
    memset(found + ((long)(int)(uVar1 - 1) - (ulong)(uVar1 - 1)),0,(ulong)uVar1);
  }
  iVar4 = ffgkyj(fptr,"NAXIS2",&naxis2,(char *)0x0,status);
  if (iVar4 == 0) {
    if (naxis2 < 1) {
      lVar8 = 0;
    }
    else {
      lVar6 = 1;
      local_568 = -1e+38;
      lVar7 = 0;
      local_540 = fptr;
      do {
        iVar4 = ffgcvd(fptr,lParse->timeCol,lVar6,1,1,0.0,&newtime,&anynul,status);
        if (iVar4 != 0) goto LAB_00127180;
        local_558 = lVar6;
        if ((newtime != local_568) || (lVar8 = lVar7, NAN(newtime) || NAN(local_568))) {
          if (lVar7 == local_550) {
            err_message = "Found more unique time stamps than caller indicated";
            goto LAB_001274f3;
          }
          lVar8 = lVar7 + 1;
          local_538[lVar7] = newtime;
          lVar6 = (long)lParse->nCols;
          local_568 = newtime;
          if (lVar6 != 0) {
            lVar9 = lVar6 * 0x110 + -0xb0;
            local_530 = newtime;
            do {
              piVar2 = lParse->colData;
              iVar4 = *(int *)(piVar2->colname + lVar9 + -0x18);
              if (iVar4 == 0x10) {
                strcpy(*(char **)(*(long *)(piVar2->colname + lVar9 + -0xc) + 8 + lVar7 * 8),
                       *(char **)(*(long *)(piVar2->colname + lVar9 + -0xc) + lVar7 * 8));
                local_568 = local_530;
              }
              else if (iVar4 == 0x52) {
                *(undefined8 *)(*(long *)(piVar2->colname + lVar9 + -0xc) + 8 + lVar7 * 8) =
                     *(undefined8 *)(*(long *)(piVar2->colname + lVar9 + -0xc) + lVar7 * 8);
              }
              else if (iVar4 == 0x29) {
                *(undefined8 *)(*(long *)(piVar2->colname + lVar9 + -0xc) + 8 + lVar7 * 8) =
                     *(undefined8 *)(*(long *)(piVar2->colname + lVar9 + -0xc) + lVar7 * 8);
              }
              lVar6 = lVar6 + -1;
              lVar9 = lVar9 + -0x110;
            } while (lVar6 != 0);
          }
        }
        iVar4 = ffgcvs(fptr,lParse->parCol,local_558,1,1,"",sPtr,&anynul,status);
        if (iVar4 != 0) goto LAB_00127180;
        iVar4 = lParse->nCols;
        lVar9 = (long)iVar4;
        lVar7 = 0;
        lVar6 = lVar9 * 0xa0;
        do {
          if (lVar9 == lVar7) {
            uVar10 = 0xffffffff;
            iVar4 = 0;
            goto LAB_00127352;
          }
          iVar5 = fits_strcasecmp(parName,lParse->varData[-1].name + lVar6);
          lVar7 = lVar7 + 1;
          lVar6 = lVar6 + -0xa0;
        } while (iVar5 != 0);
        iVar4 = (iVar4 - (int)lVar7) + 1;
        uVar10 = lVar9 - lVar7;
LAB_00127352:
        fptr = local_540;
        LVar3 = local_558;
        if (0 < iVar4) {
          uVar10 = uVar10 & 0xffffffff;
          found[uVar10] = '\x01';
          piVar2 = lParse->colData;
          iVar4 = piVar2[uVar10].datatype;
          if (iVar4 == 0x10) {
            ffgcvs(local_540,lParse->valCol,local_558,1,1,*piVar2[uVar10].array,
                   (char **)((long)piVar2[uVar10].array + lVar8 * 8),&anynul,status);
          }
          else if (iVar4 == 0x52) {
            ffgcvd(local_540,lParse->valCol,local_558,1,1,*piVar2[uVar10].array,
                   (double *)((long)piVar2[uVar10].array + lVar8 * 8),&anynul,status);
          }
          else if (iVar4 == 0x29) {
            ffgcvj(local_540,lParse->valCol,local_558,1,1,*piVar2[uVar10].array,
                   (long *)((long)piVar2[uVar10].array + lVar8 * 8),&anynul,status);
          }
          if (*status != 0) {
            return *status;
          }
        }
        lVar6 = LVar3 + 1;
        lVar7 = lVar8;
      } while (LVar3 < naxis2);
    }
    if (lVar8 < local_550) {
      err_message = "Found fewer unique time stamps than caller indicated";
LAB_001274f3:
      ffpmsg(err_message);
      *status = 0x1b3;
      return 0x1b3;
    }
    lVar8 = (long)lParse->nCols;
    if (lVar8 != 0) {
      lVar6 = lVar8 * 0xa0;
      do {
        if (parName[lVar8 + 0xff] == '\0') {
          snprintf(parName,0x100,"Parameter not found: %-30s",lParse->varData[-1].name + lVar6);
          ffpmsg(parName);
          *status = 0x1af;
        }
        lVar8 = lVar8 + -1;
        lVar6 = lVar6 + -0xa0;
      } while (lVar8 != 0);
    }
  }
LAB_00127180:
  return *status;
}

Assistant:

int fits_uncompress_hkdata( ParseData *lParse,
		       fitsfile *fptr,
                       long     ntimes,
                       double   *times,
                       int      *status )
/*                                                                           */
/* description                                                               */
/*---------------------------------------------------------------------------*/
{
   char parName[256], *sPtr[1], found[1000];
   int parNo, anynul;
   long naxis2, row, currelem;
   double currtime, newtime;

   sPtr[0] = parName;
   currelem = 0;
   currtime = -1e38;

   parNo=lParse->nCols;
   while( parNo-- ) found[parNo] = 0;

   if( ffgkyj( fptr, "NAXIS2", &naxis2, NULL, status ) ) return( *status );

   for( row=1; row<=naxis2; row++ ) {
      if( ffgcvd( fptr, lParse->timeCol, row, 1L, 1L, 0.0,
                  &newtime, &anynul, status ) ) return( *status );
      if( newtime != currtime ) {
         /*  New time encountered... propogate parameters to next row  */
         if( currelem==ntimes ) {
            ffpmsg("Found more unique time stamps than caller indicated");
            return( *status = PARSE_BAD_COL );
         }
         times[currelem++] = currtime = newtime;
         parNo = lParse->nCols;
         while( parNo-- ) {
            switch( lParse->colData[parNo].datatype ) {
            case TLONG:
               ((long*)lParse->colData[parNo].array)[currelem] =
                  ((long*)lParse->colData[parNo].array)[currelem-1];
               break;
            case TDOUBLE:
               ((double*)lParse->colData[parNo].array)[currelem] =
                  ((double*)lParse->colData[parNo].array)[currelem-1];
               break;
            case TSTRING:
               strcpy( ((char **)lParse->colData[parNo].array)[currelem],
                       ((char **)lParse->colData[parNo].array)[currelem-1] );
               break;
            }
         }
      }

      if( ffgcvs( fptr, lParse->parCol, row, 1L, 1L, "",
                  sPtr, &anynul, status ) ) return( *status );
      parNo = lParse->nCols;
      while( parNo-- )
         if( !fits_strcasecmp( parName, lParse->varData[parNo].name ) ) break;

      if( parNo>=0 ) {
         found[parNo] = 1; /* Flag this parameter as found */
         switch( lParse->colData[parNo].datatype ) {
         case TLONG:
            ffgcvj( fptr, lParse->valCol, row, 1L, 1L,
                    ((long*)lParse->colData[parNo].array)[0],
                    ((long*)lParse->colData[parNo].array)+currelem,
                    &anynul, status );
            break;
         case TDOUBLE:
            ffgcvd( fptr, lParse->valCol, row, 1L, 1L,
                    ((double*)lParse->colData[parNo].array)[0],
                    ((double*)lParse->colData[parNo].array)+currelem,
                    &anynul, status );
            break;
         case TSTRING:
            ffgcvs( fptr, lParse->valCol, row, 1L, 1L,
                    ((char**)lParse->colData[parNo].array)[0],
                    ((char**)lParse->colData[parNo].array)+currelem,
                    &anynul, status );
            break;
         }
         if( *status ) return( *status );
      }
   }

   if( currelem<ntimes ) {
      ffpmsg("Found fewer unique time stamps than caller indicated");
      return( *status = PARSE_BAD_COL );
   }

   /*  Check for any parameters which were not located in the table  */
   parNo = lParse->nCols;
   while( parNo-- )
      if( !found[parNo] ) {
         snprintf( parName, 256, "Parameter not found: %-30s", 
                  lParse->varData[parNo].name );
         ffpmsg( parName );
         *status = PARSE_SYNTAX_ERR;
      }
   return( *status );
}